

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall LINSimulationDataGenerator::SwapEnds(LINSimulationDataGenerator *this,U8 *byte)

{
  undefined4 local_20;
  undefined1 local_19;
  int n;
  U8 t;
  U8 *byte_local;
  LINSimulationDataGenerator *this_local;
  
  local_19 = 0;
  for (local_20 = 7; -1 < local_20; local_20 = local_20 + -1) {
    local_19 = local_19 | (byte)(((int)(uint)*byte >> ((byte)local_20 & 0x1f) & 1U) << 7);
    if (local_20 != 0) {
      local_19 = (byte)((int)(uint)local_19 >> 1);
    }
  }
  *byte = local_19;
  return;
}

Assistant:

void LINSimulationDataGenerator::SwapEnds( U8& byte )
{
    U8 t = 0;
    for( int n = 7; n >= 0; n-- )
    {
        t |= ( ( byte >> n ) & 1 ) << 7;
        if( n )
            t >>= 1;
    }
    byte = t;
}